

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O2

uint64_t __thiscall fmp4_stream::ingest_stream::get_duration(ingest_stream *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  uint *puVar7;
  uint *puVar8;
  bool bVar9;
  
  lVar1 = *(long *)&this->media_fragment_;
  lVar6 = *(long *)&this->field_0xd8 - lVar1;
  if (1 < (ulong)(lVar6 / 1000)) {
    lVar2 = *(long *)(lVar1 + lVar6 + -0xa0);
    lVar3 = *(long *)(lVar1 + 0x348);
    uVar4 = media_fragment::get_duration((media_fragment *)(lVar1 + lVar6 + -1000));
    return uVar4 + (lVar2 - lVar3);
  }
  if (lVar6 != 1000) {
    return 0;
  }
  uVar4 = (uint64_t)*(uint *)(lVar1 + 0x1c8);
  uVar5 = (ulong)*(uint *)(lVar1 + 0x3bc);
  puVar7 = (uint *)(*(long *)(lVar1 + 0x3d0) + 8);
  while (bVar9 = uVar5 != 0, uVar5 = uVar5 - 1, bVar9) {
    puVar8 = (uint *)(lVar1 + 0x2cc);
    if ((*(byte *)(lVar1 + 0x3ca) & 1) != 0) {
      puVar8 = puVar7;
    }
    uVar4 = uVar4 + *puVar8;
    puVar7 = puVar7 + 8;
  }
  return uVar4;
}

Assistant:

uint64_t ingest_stream::get_duration() 
	{
		if (media_fragment_.size() >= 2) 
		{
			// todo add aditional checks for timing behavior
			return media_fragment_[media_fragment_.size() - 1].tfdt_.base_media_decode_time_
				- media_fragment_[0].tfdt_.base_media_decode_time_
				+ media_fragment_[media_fragment_.size() - 1].get_duration();
		}
		if (media_fragment_.size() == 1)
		{
			// todo add aditional checks for timing behavior
			return media_fragment_[media_fragment_.size() - 1].get_duration();
		}
		return 0;
	}